

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_22fe3f::ValueSetter::~ValueSetter(ValueSetter *this)

{
  ValueSetter *this_local;
  
  (this->super_TokenFilter)._vptr_TokenFilter = (_func_int **)&PTR__ValueSetter_005955d0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->opt);
  std::__cxx11::string::~string((string *)&this->V);
  std::__cxx11::string::~string((string *)&this->DA);
  QPDFObjectHandle::TokenFilter::~TokenFilter(&this->super_TokenFilter);
  return;
}

Assistant:

~ValueSetter() override = default;